

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

bool __thiscall jsonnet::internal::FixNewlines::shouldExpand(FixNewlines *this,Array *array)

{
  bool bVar1;
  int iVar2;
  const_iterator __lhs;
  long in_RSI;
  Fodder *in_RDI;
  Element *elem;
  const_iterator __end2;
  const_iterator __begin2;
  Elements *__range2;
  reference in_stack_ffffffffffffffc8;
  __normal_iterator<const_jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
  local_28;
  long local_20;
  
  local_20 = in_RSI + 0x80;
  local_28._M_current =
       (Element *)
       std::
       vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
       ::begin((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                *)in_stack_ffffffffffffffc8);
  __lhs = std::
          vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
          ::end((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                 *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<const_jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) {
      iVar2 = countNewlines(in_RDI);
      return 0 < iVar2;
    }
    in_stack_ffffffffffffffc8 =
         __gnu_cxx::
         __normal_iterator<const_jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
         ::operator*(&local_28);
    internal::open_fodder((AST *)0x2cbb7b);
    iVar2 = countNewlines(in_RDI);
    if (0 < iVar2) break;
    __gnu_cxx::
    __normal_iterator<const_jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
    ::operator++(&local_28);
  }
  return true;
}

Assistant:

bool shouldExpand(const Array *array)
    {
        for (const auto &elem : array->elements) {
            if (countNewlines(open_fodder(elem.expr)) > 0) {
                return true;
            }
        }
        if (countNewlines(array->closeFodder) > 0) {
            return true;
        }
        return false;
    }